

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O0

void vector_push_back_empty(vector v)

{
  int iVar1;
  long in_RDI;
  vector in_stack_00000008;
  
  if (in_RDI != 0) {
    if ((*(long *)(in_RDI + 0x10) == *(long *)(in_RDI + 8)) &&
       (iVar1 = vector_reserve(in_stack_00000008,(size_t)v), iVar1 != 0)) {
      log_write_impl_va("metacall",0x120,"vector_push_back_empty",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,LOG_LEVEL_ERROR,"Vector reserve error");
    }
    else {
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void vector_push_back_empty(vector v)
{
	if (v != NULL)
	{
		if (v->size == v->capacity)
		{
			if (vector_reserve(v, v->capacity * VECTOR_CAPACITY_INCREMENT) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");

				return;
			}
		}

		++v->size;
	}
}